

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O0

void Lpk_CreateCommonOrder
               (char (*pTable) [16],int *piCofVar,int nCBars,int *pPrios,int nVars,int fVerbose)

{
  uint local_d0;
  int local_cc;
  int PrioCount;
  int ScoreMax;
  int iVarBest;
  int x;
  int y;
  int i;
  int pPres [16];
  int Score [16];
  int fVerbose_local;
  int nVars_local;
  int *pPrios_local;
  int nCBars_local;
  int *piCofVar_local;
  char (*pTable_local) [16];
  
  memset(pPres + 0xe,0,0x40);
  for (x = 0; x < nVars; x = x + 1) {
    (&y)[x] = 1;
  }
  for (x = 0; x < nCBars; x = x + 1) {
    (&y)[piCofVar[x]] = 0;
  }
  for (x = 0; x < nVars; x = x + 1) {
    if ((&y)[x] != 0) {
      for (iVarBest = 0; iVarBest < nVars; iVarBest = iVarBest + 1) {
        pPres[(long)x + 0xe] = (int)pTable[x][iVarBest] + pPres[(long)x + 0xe];
      }
      for (ScoreMax = 0; ScoreMax < nVars; ScoreMax = ScoreMax + 1) {
        pPres[(long)x + 0xe] = pPres[(long)x + 0xe] - (int)pTable[ScoreMax][x];
      }
    }
  }
  if (fVerbose != 0) {
    printf("Scores: ");
    for (x = 0; x < nVars; x = x + 1) {
      printf("%c=%d ",(ulong)(x + 0x61),(ulong)(uint)pPres[(long)x + 0xe]);
    }
    printf("   ");
    printf("Prios: ");
  }
  for (x = 0; x < nVars; x = x + 1) {
    pPrios[x] = 0x10;
  }
  local_d0 = 1;
  while( true ) {
    PrioCount = -1;
    local_cc = -100000;
    for (x = 0; x < nVars; x = x + 1) {
      if (((&y)[x] != 0) && (local_cc < pPres[(long)x + 0xe])) {
        local_cc = pPres[(long)x + 0xe];
        PrioCount = x;
      }
    }
    if (PrioCount == -1) break;
    if (fVerbose != 0) {
      printf("%d=",(ulong)local_d0);
    }
    for (x = 0; x < nVars; x = x + 1) {
      if (((&y)[x] != 0) && (pPres[(long)x + 0xe] == local_cc)) {
        pPrios[x] = local_d0;
        (&y)[x] = 0;
        if (fVerbose != 0) {
          printf("%c",(ulong)(x + 0x61));
        }
      }
    }
    if (fVerbose != 0) {
      printf(" ");
    }
    local_d0 = local_d0 + 1;
  }
  if (fVerbose != 0) {
    printf("\n");
  }
  return;
}

Assistant:

void Lpk_CreateCommonOrder( char pTable[][16], int piCofVar[], int nCBars, int pPrios[], int nVars, int fVerbose )
{
    int Score[16] = {0}, pPres[16];
    int i, y, x, iVarBest, ScoreMax, PrioCount;

    // mark the present variables
    for ( i = 0; i < nVars; i++ )
        pPres[i] = 1;
    // remove cofactored variables
    for ( i = 0; i < nCBars; i++ )
        pPres[piCofVar[i]] = 0;

    // compute scores for each leaf
    for ( i = 0; i < nVars; i++ )
    {
        if ( pPres[i] == 0 )
            continue;
        for ( y = 0; y < nVars; y++ )
            Score[i] += pTable[i][y];
        for ( x = 0; x < nVars; x++ )
            Score[i] -= pTable[x][i];
    }

    // print the scores
    if ( fVerbose )
    {
        printf( "Scores: " );
        for ( i = 0; i < nVars; i++ )
            printf( "%c=%d ", 'a'+i, Score[i] );
        printf( "   " );
        printf( "Prios: " );
    }

    // derive variable priority
    // variables with equal score receive the same priority
    for ( i = 0; i < nVars; i++ )
        pPrios[i] = 16;

    // iterate until variables remain
    for ( PrioCount = 1; ; PrioCount++ )
    {
        // find the present variable with the highest score
        iVarBest = -1;
        ScoreMax = -100000;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( ScoreMax < Score[i] )
            {
                ScoreMax = Score[i];
                iVarBest = i;
            }
        }
        if ( iVarBest == -1 )
            break;
        // give the next priority to all vars having this score
        if ( fVerbose )
            printf( "%d=", PrioCount );
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( Score[i] == ScoreMax )
            {
                pPrios[i] = PrioCount;
                pPres[i] = 0;
                if ( fVerbose )
                    printf( "%c", 'a'+i );
            }
        }
        if ( fVerbose )
            printf( " " );
    }
    if ( fVerbose )
        printf( "\n" );
}